

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O3

void __thiscall Game::resetGame(Game *this)

{
  pointer piVar1;
  pointer piVar2;
  Game *in_RSI;
  vector<int,_std::allocator<int>_> local_38;
  
  (this->gameResult).bulls = 0;
  (this->gameResult).cows = 0;
  this->guessCount = 0;
  getReferenceNumbers(&local_38,in_RSI);
  piVar1 = (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (this->referenceNumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1,(long)piVar2 - (long)piVar1);
    if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void Game::resetGame()
{
	gameResult = GameResult(0, 0);
	guessCount = 0;
	referenceNumbers = getReferenceNumbers();
}